

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_statement(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *cclass;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *cclass_00;
  char *cclass_01;
  int yypos805;
  code *pcVar11;
  char *pcVar12;
  int yythunkpos0_5;
  int yythunkpos0;
  int yythunkpos805;
  int iVar13;
  
  iVar10 = G->pos;
  iVar13 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  yy__(G);
  iVar8 = G->pos;
  iVar1 = G->thunkpos;
  yyDo(G,yyPush,4,0,"yyPush");
  iVar5 = G->pos;
  iVar9 = G->thunkpos;
  iVar4 = yymatchString(G,"while");
  if (iVar4 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar9;
    iVar5 = yymatchString(G,"until");
    if (iVar5 != 0) {
      iVar5 = G->begin;
      iVar9 = G->end;
      pcVar11 = yy_2_while_until;
      pcVar12 = "yy_2_while_until";
      goto LAB_00104eaa;
    }
LAB_00104fc7:
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,1,0,"yyPush");
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    iVar4 = yymatchString(G,"use ");
    if (iVar4 != 0) {
      yy__(G);
      iVar4 = yy_pkg_name(G);
      if (iVar4 == 0) goto LAB_0010513b;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_1_use_stmt,G->begin,G->end,"yy_1_use_stmt");
      iVar4 = G->pos;
      iVar2 = G->thunkpos;
      iVar6 = yymatchString(G,":ver<");
      if (iVar6 == 0) {
LAB_00105124:
        G->pos = iVar4;
        G->thunkpos = iVar2;
      }
      else {
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_3b10,cclass);
        pcVar12 = extraout_RDX;
        if (iVar6 == 0) goto LAB_00105124;
        do {
          iVar6 = G->pos;
          iVar3 = G->thunkpos;
          iVar7 = yymatchClass(G,(uchar *)anon_var_dwarf_3b10,pcVar12);
          pcVar12 = extraout_RDX_00;
        } while (iVar7 != 0);
        G->pos = iVar6;
        G->thunkpos = iVar3;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        yyDo(G,yy_2_use_stmt,G->begin,G->pos,"yy_2_use_stmt");
        iVar6 = yymatchChar(G,0x3e);
        if (iVar6 == 0) goto LAB_00105124;
      }
      iVar4 = yy_eat_terminator(G);
      if (iVar4 == 0) goto LAB_0010513b;
LAB_00105b67:
      iVar10 = 1;
      goto LAB_00105b77;
    }
LAB_0010513b:
    G->pos = iVar5;
    G->thunkpos = iVar9;
    iVar5 = yymatchString(G,"need");
    if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
      do {
        iVar5 = G->pos;
        iVar9 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar9;
      iVar5 = yy_pkg_name(G);
      if (iVar5 == 0) goto LAB_001051cd;
      yyDo(G,yySet,-1,0,"yySet");
      iVar5 = yy_eat_terminator(G);
      if (iVar5 == 0) goto LAB_001051cd;
      iVar10 = G->begin;
      iVar13 = G->end;
      pcVar11 = yy_3_use_stmt;
      pcVar12 = "yy_3_use_stmt";
LAB_00105b4a:
      yyDo(G,pcVar11,iVar10,iVar13,pcVar12);
      goto LAB_00105b67;
    }
LAB_001051cd:
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,3,0,"yyPush");
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    iVar4 = yymatchString(G,"my");
    if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
      do {
        iVar4 = G->pos;
        iVar2 = G->thunkpos;
        iVar6 = yy_ws(G);
      } while (iVar6 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar2;
      iVar4 = yymatchString(G,"enum");
      if ((iVar4 == 0) || (iVar4 = yy_ws(G), iVar4 == 0)) goto LAB_001052f3;
      do {
        iVar4 = G->pos;
        iVar2 = G->thunkpos;
        iVar6 = yy_ws(G);
      } while (iVar6 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar2;
      iVar4 = yy_ident(G);
      if (iVar4 == 0) goto LAB_001052f3;
      yyDo(G,yySet,-3,0,"yySet");
      yy__(G);
      iVar4 = yy_expr(G);
      if (iVar4 == 0) goto LAB_001052f3;
      yyDo(G,yySet,-2,0,"yySet");
      iVar10 = G->begin;
      iVar13 = G->end;
      pcVar11 = yy_1_enum_stmt;
      pcVar12 = "yy_1_enum_stmt";
LAB_001053a6:
      yyDo(G,pcVar11,iVar10,iVar13,pcVar12);
      iVar10 = 3;
      goto LAB_00105b77;
    }
LAB_001052f3:
    G->pos = iVar5;
    G->thunkpos = iVar9;
    iVar5 = yymatchString(G,"enum");
    if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
      do {
        iVar5 = G->pos;
        iVar9 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar9;
      iVar5 = yy_ident(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-3,0,"yySet");
        yy__(G);
        iVar5 = yy_qw(G);
        if (iVar5 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar10 = G->begin;
          iVar13 = G->end;
          pcVar11 = yy_2_enum_stmt;
          pcVar12 = "yy_2_enum_stmt";
          goto LAB_001053a6;
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,5,0,"yyPush");
    yyDo(G,yy_1_if_stmt,G->begin,G->end,"yy_1_if_stmt");
    iVar5 = yymatchString(G,"if");
    if (iVar5 != 0) {
      yy__(G);
      iVar5 = yy_expr(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-5,0,"yySet");
        yy__(G);
        iVar5 = yymatchChar(G,0x7b);
        if (iVar5 != 0) {
          yy__(G);
          iVar5 = G->pos;
          iVar9 = G->thunkpos;
          iVar4 = yy_statementlist(G);
          if (iVar4 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar9;
          }
          else {
            yyDo(G,yySet,-4,0,"yySet");
          }
          yy__(G);
          iVar5 = yymatchChar(G,0x7d);
          if (iVar5 != 0) {
            yyDo(G,yy_2_if_stmt,G->begin,G->end,"yy_2_if_stmt");
            while( true ) {
              iVar10 = G->pos;
              iVar13 = G->thunkpos;
              iVar8 = yy_ws(G);
              if (iVar8 == 0) break;
              do {
                iVar8 = G->pos;
                iVar1 = G->thunkpos;
                iVar5 = yy_ws(G);
              } while (iVar5 != 0);
              G->pos = iVar8;
              G->thunkpos = iVar1;
              iVar8 = yymatchString(G,"elsif");
              if (iVar8 == 0) break;
              yy__(G);
              iVar8 = yy_expr(G);
              if (iVar8 == 0) break;
              yyDo(G,yySet,-3,0,"yySet");
              yy__(G);
              iVar8 = yymatchChar(G,0x7b);
              if (iVar8 == 0) break;
              yy__(G);
              iVar8 = yy_statementlist(G);
              if (iVar8 == 0) break;
              yyDo(G,yySet,-2,0,"yySet");
              yy__(G);
              iVar8 = yymatchChar(G,0x7d);
              if (iVar8 == 0) break;
              yyDo(G,yy_3_if_stmt,G->begin,G->end,"yy_3_if_stmt");
            }
            G->pos = iVar10;
            G->thunkpos = iVar13;
            iVar8 = yy_ws(G);
            if (iVar8 == 0) {
LAB_00105e5a:
              G->pos = iVar10;
              G->thunkpos = iVar13;
            }
            else {
              do {
                iVar8 = G->pos;
                iVar1 = G->thunkpos;
                iVar5 = yy_ws(G);
              } while (iVar5 != 0);
              G->pos = iVar8;
              G->thunkpos = iVar1;
              iVar8 = yymatchString(G,"else");
              if ((iVar8 == 0) || (iVar8 = yy_ws(G), iVar8 == 0)) goto LAB_00105e5a;
              do {
                iVar8 = G->pos;
                iVar1 = G->thunkpos;
                iVar5 = yy_ws(G);
              } while (iVar5 != 0);
              G->pos = iVar8;
              G->thunkpos = iVar1;
              yy__(G);
              iVar8 = yymatchChar(G,0x7b);
              if (iVar8 == 0) goto LAB_00105e5a;
              yy__(G);
              iVar8 = G->pos;
              iVar1 = G->thunkpos;
              iVar5 = yy_statementlist(G);
              if (iVar5 == 0) {
                G->pos = iVar8;
                G->thunkpos = iVar1;
              }
              else {
                yyDo(G,yySet,-1,0,"yySet");
              }
              yy__(G);
              iVar8 = yymatchChar(G,0x7d);
              if (iVar8 == 0) goto LAB_00105e5a;
              yyDo(G,yy_4_if_stmt,G->begin,G->end,"yy_4_if_stmt");
            }
            yyDo(G,yy_5_if_stmt,G->begin,G->end,"yy_5_if_stmt");
            iVar10 = 5;
            goto LAB_00105b77;
          }
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,2,0,"yyPush");
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    iVar4 = yymatchString(G,"for");
    if (iVar4 != 0) {
      yy__(G);
      iVar4 = yy_expr(G);
      if (iVar4 == 0) goto LAB_00105697;
      yyDo(G,yySet,-2,0,"yySet");
      yy__(G);
      iVar4 = yy_block(G);
      if (iVar4 == 0) goto LAB_00105697;
      yyDo(G,yySet,-1,0,"yySet");
      iVar10 = G->begin;
      iVar13 = G->end;
      pcVar11 = yy_1_for_stmt;
      pcVar12 = "yy_1_for_stmt";
LAB_00105a13:
      yyDo(G,pcVar11,iVar10,iVar13,pcVar12);
      iVar10 = 2;
      goto LAB_00105b77;
    }
LAB_00105697:
    G->pos = iVar5;
    G->thunkpos = iVar9;
    iVar5 = yymatchString(G,"for");
    if (iVar5 != 0) {
      yy__(G);
      iVar5 = yy_expr(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yy__(G);
        iVar5 = yy_lambda(G);
        if (iVar5 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar10 = G->begin;
          iVar13 = G->end;
          pcVar11 = yy_2_for_stmt;
          pcVar12 = "yy_2_for_stmt";
          goto LAB_00105a13;
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,2,0,"yyPush");
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    yyDo(G,yy_1_unless_stmt,G->begin,G->end,"yy_1_unless_stmt");
    iVar4 = yymatchString(G,"unless");
    if (iVar4 != 0) {
      yy__(G);
      iVar4 = yy_expr(G);
      if (iVar4 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yy__(G);
        iVar4 = yymatchChar(G,0x7b);
        if (iVar4 != 0) {
          yy__(G);
          iVar4 = G->pos;
          iVar2 = G->thunkpos;
          iVar6 = yy_statementlist(G);
          if (iVar6 == 0) {
            G->pos = iVar4;
            G->thunkpos = iVar2;
          }
          else {
            yyDo(G,yySet,-1,0,"yySet");
          }
          yy__(G);
          iVar4 = yymatchChar(G,0x7d);
          if (iVar4 != 0) {
            iVar10 = G->begin;
            iVar13 = G->end;
            pcVar11 = yy_2_unless_stmt;
            pcVar12 = "yy_2_unless_stmt";
            goto LAB_00105a13;
          }
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar9;
    yyDo(G,yy_3_unless_stmt,G->begin,G->end,"yy_3_unless_stmt");
    iVar5 = yymatchString(G,"unless");
    if (iVar5 != 0) {
      yy__(G);
      iVar5 = yy_ident(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yy__(G);
        iVar5 = yymatchChar(G,0x7b);
        if (iVar5 != 0) {
          yy__(G);
          iVar5 = G->pos;
          iVar9 = G->thunkpos;
          iVar4 = yy_statementlist(G);
          if (iVar4 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar9;
          }
          else {
            yyDo(G,yySet,-1,0,"yySet");
          }
          yy__(G);
          iVar5 = yymatchChar(G,0x7d);
          if (iVar5 != 0) {
            iVar10 = G->begin;
            iVar13 = G->end;
            pcVar11 = yy_4_unless_stmt;
            pcVar12 = "yy_4_unless_stmt";
            goto LAB_00105a13;
          }
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,1,0,"yyPush");
    iVar5 = yymatchString(G,"module");
    if (((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) && (iVar5 = yy_pkg_name(G), iVar5 != 0)) {
      yyDo(G,yySet,-1,0,"yySet");
      iVar5 = yy_eat_terminator(G);
      if (iVar5 != 0) {
        iVar10 = G->begin;
        iVar13 = G->end;
        pcVar11 = yy_1_module_stmt;
        pcVar12 = "yy_1_module_stmt";
        goto LAB_00105b4a;
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,1,0,"yyPush");
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    iVar4 = yymatchString(G,"multi");
    if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
      yy__(G);
      iVar4 = yy_method_stmt(G);
      if (iVar4 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar10 = G->begin;
        iVar13 = G->end;
        pcVar11 = yy_1_multi_method_stmt;
        pcVar12 = "yy_1_multi_method_stmt";
        goto LAB_00105b4a;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar9;
    iVar5 = yy_method_stmt(G);
    if (iVar5 != 0) goto LAB_00105b67;
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,2,0,"yyPush");
    iVar5 = yymatchString(G,"package");
    if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
      do {
        iVar5 = G->pos;
        iVar9 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar9;
      iVar5 = yy_pkg_name(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yy__(G);
        iVar5 = yy_block(G);
        if (iVar5 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar10 = G->begin;
          iVar13 = G->end;
          pcVar11 = yy_1_package_stmt;
          pcVar12 = "yy_1_package_stmt";
          goto LAB_00105a13;
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    yyDo(G,yyPush,2,0,"yyPush");
    yyDo(G,yy_1_has_stmt,G->begin,G->end,"yy_1_has_stmt");
    iVar5 = yymatchString(G,"has");
    if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
      do {
        iVar5 = G->pos;
        iVar9 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar9;
      iVar5 = yy_attr_vars(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        iVar5 = G->pos;
        iVar9 = G->thunkpos;
        yy__(G);
        iVar4 = yymatchChar(G,0x3d);
        if (iVar4 == 0) {
LAB_00105d7c:
          G->pos = iVar5;
          G->thunkpos = iVar9;
        }
        else {
          yy__(G);
          iVar4 = yy_expr(G);
          if (iVar4 == 0) goto LAB_00105d7c;
          yyDo(G,yySet,-1,0,"yySet");
        }
        iVar5 = yy_eat_terminator(G);
        if (iVar5 != 0) {
          iVar10 = G->begin;
          iVar13 = G->end;
          pcVar11 = yy_2_has_stmt;
          pcVar12 = "yy_2_has_stmt";
          goto LAB_00105a13;
        }
      }
    }
    G->pos = iVar8;
    G->thunkpos = iVar1;
    iVar5 = yymatchString(G,"...");
    if (iVar5 == 0) {
      G->pos = iVar8;
      G->thunkpos = iVar1;
      iVar5 = yy_funcdef(G);
      if (iVar5 == 0) {
        G->pos = iVar8;
        G->thunkpos = iVar1;
        iVar5 = yy_block(G);
        if (iVar5 == 0) {
          G->pos = iVar8;
          G->thunkpos = iVar1;
          iVar5 = yymatchString(G,"END");
          if (iVar5 != 0) {
            yy__(G);
            iVar5 = yy_block(G);
            if (iVar5 != 0) {
              yyDo(G,yySet,-2,0,"yySet");
              iVar10 = G->begin;
              iVar13 = G->end;
              pcVar11 = yy_2_statement;
              pcVar12 = "yy_2_statement";
              goto LAB_00105b7d;
            }
          }
          G->pos = iVar8;
          G->thunkpos = iVar1;
          iVar5 = yymatchString(G,"BEGIN");
          if (iVar5 != 0) {
            yy__(G);
            iVar5 = yy_block(G);
            if (iVar5 != 0) {
              yyDo(G,yySet,-2,0,"yySet");
              iVar10 = G->begin;
              iVar13 = G->end;
              pcVar11 = yy_3_statement;
              pcVar12 = "yy_3_statement";
              goto LAB_00105b7d;
            }
          }
          G->pos = iVar8;
          G->thunkpos = iVar1;
          iVar5 = yymatchString(G,"KEEP");
          if (iVar5 != 0) {
            iVar5 = G->pos;
            iVar9 = G->thunkpos;
            iVar4 = yymatchClass(G,(uchar *)"",cclass_00);
            if (iVar4 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar9;
              yy__(G);
              iVar5 = yy_expr(G);
              if (iVar5 != 0) {
                yyDo(G,yySet,-1,0,"yySet");
                iVar10 = G->begin;
                iVar13 = G->end;
                pcVar11 = yy_4_statement;
                pcVar12 = "yy_4_statement";
                goto LAB_00105b7d;
              }
            }
          }
          G->pos = iVar8;
          G->thunkpos = iVar1;
          iVar5 = yymatchString(G,"UNDO");
          if (iVar5 != 0) {
            iVar5 = G->pos;
            iVar9 = G->thunkpos;
            iVar4 = yymatchClass(G,(uchar *)"",cclass_01);
            if (iVar4 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar9;
              yy__(G);
              iVar5 = yy_expr(G);
              if (iVar5 != 0) {
                yyDo(G,yySet,-1,0,"yySet");
                iVar10 = G->begin;
                iVar13 = G->end;
                pcVar11 = yy_5_statement;
                pcVar12 = "yy_5_statement";
                goto LAB_00105b7d;
              }
            }
          }
          G->pos = iVar8;
          G->thunkpos = iVar1;
          yyDo(G,yyPush,4,0,"yyPush");
          iVar5 = G->pos;
          iVar9 = G->thunkpos;
          yyDo(G,yyPush,1,0,"yyPush");
          iVar4 = yymatchString(G,"return");
          if (((iVar4 == 0) || (iVar4 = yy_ws(G), iVar4 == 0)) || (iVar4 = yy_expr(G), iVar4 == 0))
          {
            G->pos = iVar5;
            G->thunkpos = iVar9;
            iVar4 = yymatchString(G,"last");
            if (iVar4 != 0) {
              iVar5 = G->begin;
              iVar9 = G->end;
              pcVar11 = yy_1_last_stmt;
              pcVar12 = "yy_1_last_stmt";
              goto LAB_0010619a;
            }
            G->pos = iVar5;
            G->thunkpos = iVar9;
            iVar4 = yymatchString(G,"next");
            if (iVar4 != 0) {
              iVar5 = G->begin;
              iVar9 = G->end;
              pcVar11 = yy_1_next_stmt;
              pcVar12 = "yy_1_next_stmt";
              goto LAB_0010619a;
            }
            G->pos = iVar5;
            G->thunkpos = iVar9;
            iVar5 = yy_expr(G);
            if (iVar5 != 0) goto LAB_0010619f;
LAB_0010660f:
            G->pos = iVar8;
            G->thunkpos = iVar1;
            iVar8 = yymatchChar(G,0x3b);
            if (iVar8 == 0) {
              G->pos = iVar10;
              G->thunkpos = iVar13;
              return 0;
            }
            do {
              iVar10 = G->pos;
              iVar13 = G->thunkpos;
              iVar8 = yymatchChar(G,0x3b);
            } while (iVar8 != 0);
            G->pos = iVar10;
            G->thunkpos = iVar13;
            iVar10 = G->begin;
            iVar13 = G->end;
            pcVar11 = yy_7_statement;
            pcVar12 = "yy_7_statement";
          }
          else {
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_1_return_stmt,G->begin,G->end,"yy_1_return_stmt");
            pcVar11 = yyPop;
            pcVar12 = "yyPop";
            iVar5 = 1;
            iVar9 = 0;
LAB_0010619a:
            yyDo(G,pcVar11,iVar5,iVar9,pcVar12);
LAB_0010619f:
            yyDo(G,yySet,-4,0,"yySet");
            iVar5 = G->pos;
            iVar9 = G->thunkpos;
            iVar4 = yymatchChar(G,0x20);
            if (iVar4 == 0) {
LAB_00106267:
              G->pos = iVar5;
              G->thunkpos = iVar9;
              iVar4 = yymatchChar(G,0x20);
              if (iVar4 != 0) {
                do {
                  iVar4 = G->pos;
                  iVar2 = G->thunkpos;
                  iVar6 = yymatchChar(G,0x20);
                } while (iVar6 != 0);
                G->pos = iVar4;
                G->thunkpos = iVar2;
                iVar4 = yymatchString(G,"unless");
                if (iVar4 != 0) {
                  yy__(G);
                  iVar4 = yy_expr(G);
                  if (iVar4 != 0) {
                    yyDo(G,yySet,-2,0,"yySet");
                    yy__(G);
                    iVar4 = yy_eat_terminator(G);
                    if (iVar4 != 0) {
                      iVar10 = G->begin;
                      iVar13 = G->end;
                      pcVar11 = yy_2_normal_or_postfix_stmt;
                      pcVar12 = "yy_2_normal_or_postfix_stmt";
                      goto LAB_0010654e;
                    }
                  }
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar9;
              iVar4 = yymatchChar(G,0x20);
              if (iVar4 != 0) {
                do {
                  iVar4 = G->pos;
                  iVar2 = G->thunkpos;
                  iVar6 = yymatchChar(G,0x20);
                } while (iVar6 != 0);
                G->pos = iVar4;
                G->thunkpos = iVar2;
                iVar4 = yymatchString(G,"for");
                if (iVar4 != 0) {
                  yy__(G);
                  iVar4 = yy_expr(G);
                  if (iVar4 != 0) {
                    yyDo(G,yySet,-1,0,"yySet");
                    yy__(G);
                    iVar4 = yy_eat_terminator(G);
                    if (iVar4 != 0) {
                      iVar10 = G->begin;
                      iVar13 = G->end;
                      pcVar11 = yy_3_normal_or_postfix_stmt;
                      pcVar12 = "yy_3_normal_or_postfix_stmt";
                      goto LAB_0010654e;
                    }
                  }
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar9;
              iVar4 = yymatchChar(G,0x20);
              if (iVar4 != 0) {
                do {
                  iVar4 = G->pos;
                  iVar2 = G->thunkpos;
                  iVar6 = yymatchChar(G,0x20);
                } while (iVar6 != 0);
                G->pos = iVar4;
                G->thunkpos = iVar2;
                iVar4 = yymatchString(G,"while");
                if (iVar4 != 0) {
                  yy__(G);
                  iVar4 = yy_expr(G);
                  if (iVar4 != 0) {
                    yyDo(G,yySet,-1,0,"yySet");
                    yy__(G);
                    iVar4 = yy_eat_terminator(G);
                    if (iVar4 != 0) {
                      iVar10 = G->begin;
                      iVar13 = G->end;
                      pcVar11 = yy_4_normal_or_postfix_stmt;
                      pcVar12 = "yy_4_normal_or_postfix_stmt";
                      goto LAB_0010654e;
                    }
                  }
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar9;
              iVar4 = yymatchChar(G,0x20);
              if (iVar4 != 0) {
                do {
                  iVar4 = G->pos;
                  iVar2 = G->thunkpos;
                  iVar6 = yymatchChar(G,0x20);
                } while (iVar6 != 0);
                G->pos = iVar4;
                G->thunkpos = iVar2;
                iVar4 = yymatchString(G,"until");
                if (iVar4 != 0) {
                  yy__(G);
                  iVar4 = yy_expr(G);
                  if (iVar4 != 0) {
                    yyDo(G,yySet,-1,0,"yySet");
                    yy__(G);
                    iVar4 = yy_eat_terminator(G);
                    if (iVar4 != 0) {
                      iVar10 = G->begin;
                      iVar13 = G->end;
                      pcVar11 = yy_5_normal_or_postfix_stmt;
                      pcVar12 = "yy_5_normal_or_postfix_stmt";
                      goto LAB_0010654e;
                    }
                  }
                }
              }
              G->pos = iVar5;
              G->thunkpos = iVar9;
              yy__(G);
              iVar5 = yy_eat_terminator(G);
              if (iVar5 == 0) goto LAB_0010660f;
              iVar10 = G->begin;
              iVar13 = G->end;
              pcVar11 = yy_6_normal_or_postfix_stmt;
              pcVar12 = "yy_6_normal_or_postfix_stmt";
            }
            else {
              do {
                iVar4 = G->pos;
                iVar2 = G->thunkpos;
                iVar6 = yymatchChar(G,0x20);
              } while (iVar6 != 0);
              G->pos = iVar4;
              G->thunkpos = iVar2;
              iVar4 = yymatchString(G,"if");
              if (iVar4 == 0) goto LAB_00106267;
              yy__(G);
              iVar4 = yy_expr(G);
              if (iVar4 == 0) goto LAB_00106267;
              yyDo(G,yySet,-3,0,"yySet");
              yy__(G);
              iVar4 = yy_eat_terminator(G);
              if (iVar4 == 0) goto LAB_00106267;
              iVar10 = G->begin;
              iVar13 = G->end;
              pcVar11 = yy_1_normal_or_postfix_stmt;
              pcVar12 = "yy_1_normal_or_postfix_stmt";
            }
LAB_0010654e:
            yyDo(G,pcVar11,iVar10,iVar13,pcVar12);
            yyDo(G,yyPop,4,0,"yyPop");
            yyDo(G,yySet,-2,0,"yySet");
            iVar10 = G->begin;
            iVar13 = G->end;
            pcVar11 = yy_6_statement;
            pcVar12 = "yy_6_statement";
          }
          goto LAB_00105b7d;
        }
        yyDo(G,yySet,-3,0,"yySet");
        do {
          iVar10 = G->pos;
          iVar13 = G->thunkpos;
          iVar8 = yymatchChar(G,0x3b);
        } while (iVar8 != 0);
      }
      else {
        yy__(G);
        do {
          iVar10 = G->pos;
          iVar13 = G->thunkpos;
          iVar8 = yymatchChar(G,0x3b);
        } while (iVar8 != 0);
      }
      G->pos = iVar10;
      G->thunkpos = iVar13;
      goto LAB_00105b82;
    }
    iVar10 = G->begin;
    iVar13 = G->end;
    pcVar11 = yy_1_statement;
    pcVar12 = "yy_1_statement";
  }
  else {
    iVar5 = G->begin;
    iVar9 = G->end;
    pcVar11 = yy_1_while_until;
    pcVar12 = "yy_1_while_until";
LAB_00104eaa:
    yyDo(G,pcVar11,iVar5,iVar9,pcVar12);
    yyDo(G,yySet,-4,0,"yySet");
    yy__(G);
    iVar5 = yy_expr(G);
    if (iVar5 == 0) goto LAB_00104fc7;
    yyDo(G,yySet,-3,0,"yySet");
    yyDo(G,yy_1_while_stmt,G->begin,G->end,"yy_1_while_stmt");
    yy__(G);
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    iVar4 = yy_block(G);
    if (iVar4 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar9;
      iVar5 = yy_lambda(G);
      if (iVar5 == 0) goto LAB_00104fc7;
      yyDo(G,yySet,-1,0,"yySet");
      iVar10 = G->begin;
      iVar13 = G->end;
      pcVar11 = yy_3_while_stmt;
      pcVar12 = "yy_3_while_stmt";
    }
    else {
      yyDo(G,yySet,-2,0,"yySet");
      iVar10 = G->begin;
      iVar13 = G->end;
      pcVar11 = yy_2_while_stmt;
      pcVar12 = "yy_2_while_stmt";
    }
    yyDo(G,pcVar11,iVar10,iVar13,pcVar12);
    iVar10 = 4;
LAB_00105b77:
    pcVar12 = "yyPop";
    pcVar11 = yyPop;
    iVar13 = 0;
  }
LAB_00105b7d:
  yyDo(G,pcVar11,iVar10,iVar13,pcVar12);
LAB_00105b82:
  yyDo(G,yyPop,3,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_statement(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "statement"));
  if (!yy__(G))  goto l967;

  {  int yypos968= G->pos, yythunkpos968= G->thunkpos;  if (!yy_while_stmt(G))  goto l969;
  goto l968;
  l969:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_use_stmt(G))  goto l970;
  goto l968;
  l970:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_enum_stmt(G))  goto l971;
  goto l968;
  l971:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_if_stmt(G))  goto l972;
  goto l968;
  l972:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_for_stmt(G))  goto l973;
  goto l968;
  l973:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_unless_stmt(G))  goto l974;
  goto l968;
  l974:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_module_stmt(G))  goto l975;
  goto l968;
  l975:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_multi_method_stmt(G))  goto l976;
  goto l968;
  l976:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_package_stmt(G))  goto l977;
  goto l968;
  l977:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_has_stmt(G))  goto l978;
  goto l968;
  l978:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "...")) goto l979;
  yyDo(G, yy_1_statement, G->begin, G->end, "yy_1_statement");
  goto l968;
  l979:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_funcdef(G))  goto l980;
  if (!yy__(G))  goto l980;

  l981:;	
  {  int yypos982= G->pos, yythunkpos982= G->thunkpos;  if (!yymatchChar(G, ';')) goto l982;
  goto l981;
  l982:;	  G->pos= yypos982; G->thunkpos= yythunkpos982;
  }  goto l968;
  l980:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_block(G))  goto l983;
  yyDo(G, yySet, -3, 0, "yySet");

  l984:;	
  {  int yypos985= G->pos, yythunkpos985= G->thunkpos;  if (!yymatchChar(G, ';')) goto l985;
  goto l984;
  l985:;	  G->pos= yypos985; G->thunkpos= yythunkpos985;
  }  goto l968;
  l983:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "END")) goto l986;
  if (!yy__(G))  goto l986;
  if (!yy_block(G))  goto l986;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_statement, G->begin, G->end, "yy_2_statement");
  goto l968;
  l986:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "BEGIN")) goto l987;
  if (!yy__(G))  goto l987;
  if (!yy_block(G))  goto l987;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_3_statement, G->begin, G->end, "yy_3_statement");
  goto l968;
  l987:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "KEEP")) goto l988;

  {  int yypos989= G->pos, yythunkpos989= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l989;
  goto l988;
  l989:;	  G->pos= yypos989; G->thunkpos= yythunkpos989;
  }  if (!yy__(G))  goto l988;
  if (!yy_expr(G))  goto l988;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_statement, G->begin, G->end, "yy_4_statement");
  goto l968;
  l988:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "UNDO")) goto l990;

  {  int yypos991= G->pos, yythunkpos991= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l991;
  goto l990;
  l991:;	  G->pos= yypos991; G->thunkpos= yythunkpos991;
  }  if (!yy__(G))  goto l990;
  if (!yy_expr(G))  goto l990;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_statement, G->begin, G->end, "yy_5_statement");
  goto l968;
  l990:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_normal_or_postfix_stmt(G))  goto l992;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_6_statement, G->begin, G->end, "yy_6_statement");
  goto l968;
  l992:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchChar(G, ';')) goto l967;

  l993:;	
  {  int yypos994= G->pos, yythunkpos994= G->thunkpos;  if (!yymatchChar(G, ';')) goto l994;
  goto l993;
  l994:;	  G->pos= yypos994; G->thunkpos= yythunkpos994;
  }  yyDo(G, yy_7_statement, G->begin, G->end, "yy_7_statement");

  }
  l968:;	  yyprintf((stderr, "  ok   statement"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l967:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "statement"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}